

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

string * __thiscall
QPDFObjectHandle::getUTF8Value_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  QPDF_String *this_00;
  string local_40;
  
  this_00 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  if (this_00 == (QPDF_String *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"returning empty string","")
    ;
    typeWarning(this,"string",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,anon_var_dwarf_49b1 + 4);
  }
  else {
    QPDF_String::getUTF8Val_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getUTF8Value() const
{
    if (auto str = as<QPDF_String>()) {
        return str->getUTF8Val();
    } else {
        typeWarning("string", "returning empty string");
        QTC::TC("qpdf", "QPDFObjectHandle string returning empty utf8");
        return "";
    }
}